

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcAnnotationSurfaceOccurrence::~IfcAnnotationSurfaceOccurrence
          (IfcAnnotationSurfaceOccurrence *this)

{
  char *pcVar1;
  long lVar2;
  void *pvVar3;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem + -0x18);
  pcVar1 = (this->super_IfcAnnotationOccurrence).super_IfcStyledItem.Name.ptr.field_2._M_local_buf +
           lVar2;
  pcVar1[-0x58] = 'p';
  pcVar1[-0x57] = 'X';
  pcVar1[-0x56] = -0x73;
  pcVar1[-0x55] = '\0';
  pcVar1[-0x54] = '\0';
  pcVar1[-0x53] = '\0';
  pcVar1[-0x52] = '\0';
  pcVar1[-0x51] = '\0';
  pcVar1[0x38] = -0x40;
  pcVar1[0x39] = 'X';
  pcVar1[0x3a] = -0x73;
  pcVar1[0x3b] = '\0';
  pcVar1[0x3c] = '\0';
  pcVar1[0x3d] = '\0';
  pcVar1[0x3e] = '\0';
  pcVar1[0x3f] = '\0';
  pcVar1[-0x48] = -0x68;
  pcVar1[-0x47] = 'X';
  pcVar1[-0x46] = -0x73;
  pcVar1[-0x45] = '\0';
  pcVar1[-0x44] = '\0';
  pcVar1[-0x43] = '\0';
  pcVar1[-0x42] = '\0';
  pcVar1[-0x41] = '\0';
  if (*(char **)(pcVar1 + -0x10) != pcVar1) {
    operator_delete(*(char **)(pcVar1 + -0x10));
  }
  pvVar3 = *(void **)(&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem.
                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>.field_0x20 +
                     lVar2);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3);
    return;
  }
  return;
}

Assistant:

IfcAnnotationSurfaceOccurrence() : Object("IfcAnnotationSurfaceOccurrence") {}